

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb-compat-util.h
# Opt level: O0

char * mmdb_strndup(char *str,size_t n)

{
  size_t __n;
  char *copy;
  size_t len;
  size_t n_local;
  char *str_local;
  
  __n = mmdb_strnlen(str,n);
  str_local = (char *)malloc(__n + 1);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    memcpy(str_local,str,__n);
    str_local[__n] = '\0';
  }
  return str_local;
}

Assistant:

static char *mmdb_strndup(const char *str, size_t n) {
    size_t len;
    char *copy;

    len = mmdb_strnlen(str, n);
    if ((copy = malloc(len + 1)) == NULL)
        return (NULL);
    memcpy(copy, str, len);
    copy[len] = '\0';
    return (copy);
}